

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall CLPIParser::composeExtentInfo(CLPIParser *this,BitStreamWriter *writer)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint value;
  int iVar4;
  int iVar5;
  uint32_t uVar6;
  int iVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint32_t *puStack_40;
  int beforeExtentCount;
  uint32_t *ProgramInfo_StartPos;
  uint32_t *CPI_SS_StartPos;
  uint32_t *extentStartPos;
  int entries;
  int beforeCount;
  uint32_t *lengthPos;
  BitStreamWriter *writer_local;
  CLPIParser *this_local;
  
  puVar8 = BitStream::getBuffer(&writer->super_BitStream);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  iVar3 = iVar3 / 8;
  BitStreamWriter::putBits(writer,0x20,0);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->interleaveInfo);
  if (!bVar1) {
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x18,0);
    value = 1;
    if ((this->isDependStream & 1U) != 0) {
      value = 3;
    }
    BitStreamWriter::putBits(writer,8,value);
    BitStreamWriter::putBits(writer,0x20,0x20004);
    puVar9 = BitStream::getBuffer(&writer->super_BitStream);
    iVar4 = BitStreamWriter::getBitsCount(writer);
    BitStreamWriter::putBits(writer,0x20,0);
    BitStreamWriter::putBits(writer,0x20,0);
    ProgramInfo_StartPos = (uint32_t *)0x0;
    puStack_40 = (uint32_t *)0x0;
    if ((this->isDependStream & 1U) != 0) {
      BitStreamWriter::putBits(writer,0x20,0x20005);
      puVar10 = BitStream::getBuffer(&writer->super_BitStream);
      iVar5 = BitStreamWriter::getBitsCount(writer);
      puStack_40 = (uint32_t *)(puVar10 + iVar5 / 8);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0x20006);
      puVar10 = BitStream::getBuffer(&writer->super_BitStream);
      iVar5 = BitStreamWriter::getBitsCount(writer);
      ProgramInfo_StartPos = (uint32_t *)(puVar10 + iVar5 / 8);
      BitStreamWriter::putBits(writer,0x20,0);
      BitStreamWriter::putBits(writer,0x20,0);
    }
    iVar5 = BitStreamWriter::getBitsCount(writer);
    if (iVar5 % 0x20 != 0) {
      BitStreamWriter::putBits(writer,0x10,0);
    }
    iVar5 = BitStreamWriter::getBitsCount(writer);
    uVar6 = my_ntohl(iVar5 / 8 - iVar3);
    *(uint32_t *)((long)(puVar8 + iVar2 / 8) + 4) = uVar6;
    iVar5 = BitStreamWriter::getBitsCount(writer);
    uVar6 = my_ntohl(iVar5 / 8 - iVar3);
    *(uint32_t *)(puVar9 + iVar4 / 8) = uVar6;
    iVar5 = BitStreamWriter::getBitsCount(writer);
    composeExtentStartPoint(this,writer);
    iVar7 = BitStreamWriter::getBitsCount(writer);
    uVar6 = my_ntohl(iVar7 / 8 - iVar5 / 8);
    *(uint32_t *)((long)(puVar9 + iVar4 / 8) + 4) = uVar6;
    if ((this->isDependStream & 1U) != 0) {
      iVar4 = BitStreamWriter::getBitsCount(writer);
      uVar6 = my_ntohl(iVar4 / 8 - iVar3);
      *puStack_40 = uVar6;
      iVar4 = BitStreamWriter::getBitsCount(writer);
      composeProgramInfo(this,writer,true);
      iVar5 = BitStreamWriter::getBitsCount(writer);
      uVar6 = my_ntohl(iVar5 / 8 - iVar4 / 8);
      puStack_40[1] = uVar6;
      iVar4 = BitStreamWriter::getBitsCount(writer);
      uVar6 = my_ntohl(iVar4 / 8 - iVar3);
      *ProgramInfo_StartPos = uVar6;
      iVar4 = BitStreamWriter::getBitsCount(writer);
      composeCPI(this,writer,true);
      iVar5 = BitStreamWriter::getBitsCount(writer);
      uVar6 = my_ntohl(iVar5 / 8 - iVar4 / 8);
      ProgramInfo_StartPos[1] = uVar6;
    }
    iVar4 = BitStreamWriter::getBitsCount(writer);
    uVar6 = my_ntohl((iVar4 / 8 - iVar3) - 4);
    *(uint32_t *)(puVar8 + iVar2 / 8) = uVar6;
  }
  return;
}

Assistant:

void CLPIParser::composeExtentInfo(BitStreamWriter& writer)
{
    const auto lengthPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    const int beforeCount = writer.getBitsCount() / 8;

    writer.putBits(32, 0);  // length

    if (interleaveInfo.empty())
        return;

    writer.putBits(32, 0);  // skip data block start address
    writer.putBits(24, 0);  // reserved for world align

    const int entries = isDependStream ? 3 : 1;
    writer.putBits(8, entries);

    // write Extent_Start_Point header

    writer.putBits(32, 0x00020004);  // extent start point
    const auto extentStartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

    writer.putBits(32, 0);  // skip extent start address
    writer.putBits(32, 0);  // skip extent dataLen

    uint32_t* CPI_SS_StartPos = nullptr;
    uint32_t* ProgramInfo_StartPos = nullptr;
    if (isDependStream)
    {
        // write ProgramInfo_SS header
        writer.putBits(32, 0x00020005);  // extent start point
        ProgramInfo_StartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

        writer.putBits(32, 0);  // skip extent start address
        writer.putBits(32, 0);  // skip extent dataLen

        // write CPI_SS header
        writer.putBits(32, 0x00020006);  // extent start point
        CPI_SS_StartPos = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);

        writer.putBits(32, 0);  // skip extent start address
        writer.putBits(32, 0);  // skip extent dataLen
    }

    if (writer.getBitsCount() % 32)
        writer.putBits(16, 0);

    lengthPos[1] =
        my_htonl(writer.getBitsCount() / 8 - beforeCount);  // data_block_start_address, same as extentStart point start

    // write Extent_Start_Point body
    *extentStartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
    int beforeExtentCount = writer.getBitsCount() / 8;
    composeExtentStartPoint(writer);
    extentStartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);

    if (isDependStream)
    {
        // write ProgramInfo_SS body
        *ProgramInfo_StartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
        beforeExtentCount = writer.getBitsCount() / 8;
        composeProgramInfo(writer, true);
        ProgramInfo_StartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);

        // write CPI_SS body
        *CPI_SS_StartPos = my_htonl(writer.getBitsCount() / 8 - beforeCount);
        beforeExtentCount = writer.getBitsCount() / 8;
        composeCPI(writer, true);
        CPI_SS_StartPos[1] = my_htonl(writer.getBitsCount() / 8 - beforeExtentCount);
    }

    *lengthPos = my_htonl(writer.getBitsCount() / 8 - beforeCount - 4);
}